

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O0

bool __thiscall OpenMesh::IO::_OFFReader_::can_u_read(_OFFReader_ *this,istream *_is)

{
  bool bVar1;
  int iVar2;
  long lStack_1038;
  bool vertexDimensionTooHigh;
  streamsize remainingChars;
  char *p;
  char line [4096];
  istream *_is_local;
  _OFFReader_ *this_local;
  
  Options::cleanup(&this->options_,(EVP_PKEY_CTX *)_is);
  std::istream::getline((char *)_is,(long)&p);
  remainingChars = (streamsize)&p;
  lStack_1038 = std::istream::gcount();
  bVar1 = false;
  if (((1 < lStack_1038) && ((char)p == 'S')) && (p._1_1_ == 'T')) {
    Options::operator+=(&this->options_,0x40);
    remainingChars = (long)&p + 2;
    lStack_1038 = lStack_1038 + -2;
  }
  if ((0 < lStack_1038) && (*(char *)remainingChars == 'C')) {
    Options::operator+=(&this->options_,0x20);
    Options::operator+=(&this->options_,0x200);
    remainingChars = remainingChars + 1;
    lStack_1038 = lStack_1038 + -1;
  }
  if ((0 < lStack_1038) && (*(char *)remainingChars == 'N')) {
    Options::operator+=(&this->options_,0x10);
    remainingChars = remainingChars + 1;
    lStack_1038 = lStack_1038 + -1;
  }
  if ((0 < lStack_1038) && (*(char *)remainingChars == '4')) {
    bVar1 = true;
    remainingChars = remainingChars + 1;
    lStack_1038 = lStack_1038 + -1;
  }
  if ((0 < lStack_1038) && (*(char *)remainingChars == 'n')) {
    bVar1 = true;
    remainingChars = remainingChars + 1;
    lStack_1038 = lStack_1038 + -1;
  }
  if ((((lStack_1038 < 3) || (*(char *)remainingChars != 'O')) ||
      (*(char *)(remainingChars + 1) != 'F')) || (*(char *)(remainingChars + 2) != 'F')) {
    this_local._7_1_ = false;
  }
  else {
    if (lStack_1038 < 4) {
      lStack_1038 = 0;
    }
    else {
      lStack_1038 = lStack_1038 + -4;
    }
    if (5 < lStack_1038) {
      iVar2 = strncmp((char *)(remainingChars + 4),"BINARY",6);
      if (iVar2 == 0) {
        Options::operator+=(&this->options_,1);
      }
    }
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool _OFFReader_::can_u_read(std::istream& _is) const
{
  options_.cleanup();

  // read 1st line
  char line[LINE_LEN], *p;
  _is.getline(line, LINE_LEN);
  p = line;

  std::streamsize remainingChars = _is.gcount();

  bool vertexDimensionTooHigh = false;

  // check header: [ST][C][N][4][n]OFF BINARY

  if ( ( remainingChars > 1 ) && ( p[0] == 'S' && p[1] == 'T') )
  { options_ += Options::VertexTexCoord; p += 2; remainingChars -= 2; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'C') )
  { options_ += Options::VertexColor;
    options_ += Options::FaceColor; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'N') )
  { options_ += Options::VertexNormal; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && (p[0] == '4' ) )
  { vertexDimensionTooHigh = true; ++p; --remainingChars; }

  if ( ( remainingChars > 0 ) && ( p[0] == 'n') )
  { vertexDimensionTooHigh = true; ++p; --remainingChars; }

  if ( ( remainingChars < 3 ) || (!(p[0] == 'O' && p[1] == 'F' && p[2] == 'F')  ) )
    return false;

  p += 4;

  // Detect possible garbage and make sure, we don't have an underflow
  if ( remainingChars >= 4 )
    remainingChars -= 4;
  else
    remainingChars = 0;

  if ( ( remainingChars >= 6 ) && ( strncmp(p, "BINARY", 6) == 0 ) )
    options_+= Options::Binary;

  // vertex Dimensions != 3 are currently not supported
  if (vertexDimensionTooHigh)
    return false;

  return true;
}